

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack_t.cpp
# Opt level: O3

stack_t * __thiscall deci::stack_t::operator=(stack_t *this,stack_t *move)

{
  pointer ppvVar1;
  pointer ppvVar2;
  
  if (this != move) {
    ppvVar1 = (this->storage).super__Vector_base<deci::value_t_*,_std::allocator<deci::value_t_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppvVar2 = (move->storage).super__Vector_base<deci::value_t_*,_std::allocator<deci::value_t_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    (this->storage).super__Vector_base<deci::value_t_*,_std::allocator<deci::value_t_*>_>._M_impl.
    super__Vector_impl_data._M_start =
         (move->storage).super__Vector_base<deci::value_t_*,_std::allocator<deci::value_t_*>_>.
         _M_impl.super__Vector_impl_data._M_start;
    (this->storage).super__Vector_base<deci::value_t_*,_std::allocator<deci::value_t_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppvVar2;
    (this->storage).super__Vector_base<deci::value_t_*,_std::allocator<deci::value_t_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (move->storage).super__Vector_base<deci::value_t_*,_std::allocator<deci::value_t_*>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    (move->storage).super__Vector_base<deci::value_t_*,_std::allocator<deci::value_t_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (move->storage).super__Vector_base<deci::value_t_*,_std::allocator<deci::value_t_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (move->storage).super__Vector_base<deci::value_t_*,_std::allocator<deci::value_t_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (ppvVar1 != (pointer)0x0) {
      operator_delete(ppvVar1);
    }
    dictionary_t::operator=(&this->context,&move->context);
  }
  return this;
}

Assistant:

stack_t& stack_t::operator = (stack_t&& move) {
    if (this != &move) {
      this->storage = std::move(move.storage);
      this->context = std::move(move.context);
    }
    return *this;
  }